

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_dec
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  basic_format_specs<char> *specs;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  uint uVar2;
  uint uVar3;
  int num_digits;
  string_view prefix;
  write_int_data<char> data;
  write_int_data<char> local_70;
  anon_class_48_3_ff6d91eb local_60;
  
  uVar2 = this->abs_value | 1;
  uVar3 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  num_digits = (uVar3 + 1) -
               (uint)(this->abs_value <
                     *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar3 * 4));
  uVar3 = this->prefix_size;
  bVar1.container = (this->out).container;
  specs = this->specs;
  prefix.size_._0_4_ = uVar3;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_70,num_digits,prefix,specs);
  local_60.data.size = local_70.size;
  local_60.data.padding = local_70.padding;
  local_60.prefix.data_ = this->prefix;
  local_60.prefix.size_ = (ulong)uVar3;
  local_60.f.this =
       (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
        *)this;
  local_60.f.num_digits = num_digits;
  bVar1 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_dec()::_lambda(char*)_1_>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,int,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_dec()::_lambda(char*)_1_)::_lambda(char*)_1_>
                    (bVar1,specs,local_70.size,local_70.size,&local_60);
  (this->out).container = bVar1.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }